

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::emit_shufflevector_instruction(Impl *impl,ShuffleVectorInst *inst)

{
  Id arg;
  uint uVar1;
  uint32_t lit;
  Operation *op_00;
  Value *value;
  Type *this;
  undefined4 local_2c;
  uint i_1;
  uint num_outputs;
  uint i;
  Operation *op;
  ShuffleVectorInst *inst_local;
  Impl *impl_local;
  
  op_00 = Converter::Impl::allocate(impl,OpVectorShuffle,(Value *)inst);
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    value = LLVMBC::Instruction::getOperand(&inst->super_Instruction,i_1);
    arg = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(op_00,arg);
  }
  this = LLVMBC::Value::getType((Value *)inst);
  uVar1 = LLVMBC::Type::getVectorNumElements(this);
  for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
    lit = LLVMBC::ShuffleVectorInst::getMaskValue(inst,local_2c);
    Operation::add_literal(op_00,lit);
  }
  Converter::Impl::add(impl,op_00,false);
  return true;
}

Assistant:

bool emit_shufflevector_instruction(Converter::Impl &impl, const llvm::ShuffleVectorInst *inst)
{
	Operation *op = impl.allocate(spv::OpVectorShuffle, inst);

	for (unsigned i = 0; i < 2; i++)
		op->add_id(impl.get_id_for_value(inst->getOperand(i)));

	unsigned num_outputs = inst->getType()->getVectorNumElements();
	for (unsigned i = 0; i < num_outputs; i++)
		op->add_literal(inst->getMaskValue(i));

	impl.add(op);
	return true;
}